

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpvtt.cc
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *payload_str;
  reference local_150;
  string *payload;
  iterator iStack_140;
  int idx;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  iter_t j_1;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  iter_t i_1;
  Setting *setting;
  _List_const_iterator<libwebvtt::Setting> local_108;
  iter_t j;
  _List_const_iterator<libwebvtt::Setting> local_f8;
  iter_t i;
  Time *sp;
  Time *st;
  undefined1 local_d8 [4];
  int e_2;
  Cue cue;
  undefined1 local_60 [4];
  int e_1;
  Parser parser;
  int e;
  char *filename;
  VttReader reader;
  char **argv_local;
  int argc_local;
  
  reader.file_ = (FILE *)argv;
  if (argc == 2) {
    libwebvtt::VttReader::VttReader((VttReader *)&filename);
    iVar3 = libwebvtt::VttReader::Open((VttReader *)&filename,*(char **)(reader.file_ + 8));
    if (iVar3 == 0) {
      libwebvtt::Parser::Parser((Parser *)local_60,(Reader *)&filename);
      cue.payload.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size._4_4_ = libwebvtt::Parser::Init((Parser *)local_60);
      if (cue.payload.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._4_4_ == 0) {
        libwebvtt::Cue::Cue((Cue *)local_d8);
        while (iVar3 = libwebvtt::Parser::Parse((Parser *)local_60,(Cue *)local_d8),
              pFVar1 = _stdout, -1 < iVar3) {
          if (0 < iVar3) {
            argv_local._4_4_ = 0;
            goto LAB_001067ef;
          }
          uVar4 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"cue identifier: \"%s\"\n",uVar4);
          fprintf(_stdout,"cue start time: \"HH=%i MM=%i SS=%i SSS=%i\"\n",(ulong)(uint)cue._24_4_,
                  (ulong)(uint)cue._28_4_,(ulong)(uint)cue.start_time.hours,
                  (ulong)(uint)cue.start_time.minutes);
          i._M_node = (_List_node_base *)&cue.start_time.seconds;
          fprintf(_stdout,"cue stop time: \"HH=%i MM=%i SS=%i SSS=%i\"\n",
                  (ulong)(uint)cue.start_time.seconds,(ulong)(uint)cue.start_time.milliseconds,
                  (ulong)(uint)cue.stop_time.hours,(ulong)(uint)cue.stop_time.minutes);
          j._M_node = (_List_node_base *)
                      std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::
                      begin((list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *)
                            &cue.stop_time.seconds);
          std::_List_const_iterator<libwebvtt::Setting>::_List_const_iterator
                    (&local_f8,(iterator *)&j);
          setting = (Setting *)
                    std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::end
                              ((list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *)
                               &cue.stop_time.seconds);
          std::_List_const_iterator<libwebvtt::Setting>::_List_const_iterator
                    (&local_108,(iterator *)&setting);
          bVar2 = std::operator==(&local_f8,&local_108);
          if (bVar2) {
            fprintf(_stdout,"cue setting: <no settings present>\n");
          }
          else {
            while (bVar2 = std::operator!=(&local_f8,&local_108), bVar2) {
              i_1._M_node = (_List_node_base *)
                            std::_List_const_iterator<libwebvtt::Setting>::operator++(&local_f8,0);
              std::_List_const_iterator<libwebvtt::Setting>::operator*(&i_1);
              pFVar1 = _stdout;
              uVar4 = std::__cxx11::string::c_str();
              uVar5 = std::__cxx11::string::c_str();
              fprintf(pFVar1,"cue setting: name=%s value=%s\n",uVar4,uVar5);
            }
          }
          j_1._M_node = (_List_node_base *)
                        std::__cxx11::
                        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&cue.settings.
                                    super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>
                                    ._M_impl._M_node._M_size);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_128,(iterator *)&j_1);
          iStack_140 = std::__cxx11::
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&cue.settings.
                                 super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>
                                 ._M_impl._M_node._M_size);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_138,&stack0xfffffffffffffec0);
          payload._4_4_ = 1;
          while (bVar2 = std::operator!=(&local_128,&local_138), bVar2) {
            payload_str = (char *)std::
                                  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator++(&local_128,0);
            local_150 = std::
                        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&payload_str);
            uVar4 = std::__cxx11::string::c_str();
            fprintf(_stdout,"cue payload[%i]: \"%s\"\n",(ulong)payload._4_4_,uVar4);
            payload._4_4_ = payload._4_4_ + 1;
          }
          fprintf(_stdout,"\n");
          fflush(_stdout);
        }
        fprintf(_stderr,"error parsing cue\n");
        argv_local._4_4_ = 1;
LAB_001067ef:
        parser.unget_ = 1;
        libwebvtt::Cue::~Cue((Cue *)local_d8);
      }
      else {
        fprintf(_stderr,"parser init failed\n");
        argv_local._4_4_ = 1;
        parser.unget_ = 1;
      }
      libwebvtt::Parser::~Parser((Parser *)local_60);
    }
    else {
      fprintf(_stderr,"open failed\n");
      argv_local._4_4_ = 1;
      parser.unget_ = 1;
    }
    libwebvtt::VttReader::~VttReader((VttReader *)&filename);
  }
  else {
    fprintf(_stdout,"usage: dumpvtt <vtt file>\n");
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc != 2) {
    fprintf(stdout, "usage: dumpvtt <vtt file>\n");
    return EXIT_SUCCESS;
  }

  libwebvtt::VttReader reader;
  const char* const filename = argv[1];

  if (int e = reader.Open(filename)) {
    (void)e;
    fprintf(stderr, "open failed\n");
    return EXIT_FAILURE;
  }

  libwebvtt::Parser parser(&reader);

  if (int e = parser.Init()) {
    (void)e;
    fprintf(stderr, "parser init failed\n");
    return EXIT_FAILURE;
  }

  for (libwebvtt::Cue cue;;) {
    const int e = parser.Parse(&cue);

    if (e < 0) {  // error
      fprintf(stderr, "error parsing cue\n");
      return EXIT_FAILURE;
    }

    if (e > 0)  // EOF
      return EXIT_SUCCESS;

    fprintf(stdout, "cue identifier: \"%s\"\n", cue.identifier.c_str());

    const libwebvtt::Time& st = cue.start_time;
    fprintf(stdout, "cue start time: \"HH=%i MM=%i SS=%i SSS=%i\"\n", st.hours,
            st.minutes, st.seconds, st.milliseconds);

    const libwebvtt::Time& sp = cue.stop_time;
    fprintf(stdout, "cue stop time: \"HH=%i MM=%i SS=%i SSS=%i\"\n", sp.hours,
            sp.minutes, sp.seconds, sp.milliseconds);

    {
      typedef libwebvtt::Cue::settings_t::const_iterator iter_t;
      iter_t i = cue.settings.begin();
      const iter_t j = cue.settings.end();

      if (i == j) {
        fprintf(stdout, "cue setting: <no settings present>\n");
      } else {
        while (i != j) {
          const libwebvtt::Setting& setting = *i++;
          fprintf(stdout, "cue setting: name=%s value=%s\n",
                  setting.name.c_str(), setting.value.c_str());
        }
      }
    }

    {
      typedef libwebvtt::Cue::payload_t::const_iterator iter_t;
      iter_t i = cue.payload.begin();
      const iter_t j = cue.payload.end();

      int idx = 1;
      while (i != j) {
        const std::string& payload = *i++;
        const char* const payload_str = payload.c_str();
        fprintf(stdout, "cue payload[%i]: \"%s\"\n", idx, payload_str);
        ++idx;
      }
    }

    fprintf(stdout, "\n");
    fflush(stdout);
  }
}